

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O3

qsizetype QtPrivate::findString
                    (QStringView haystack0,qsizetype from,QStringView needle0,CaseSensitivity cs)

{
  char16_t cVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  long lVar5;
  int iVar6;
  char16_t *pcVar7;
  long lVar8;
  char16_t *pcVar9;
  byte bVar10;
  long lVar11;
  long lVar12;
  uint uVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  char16_t *pcVar17;
  uint uVar18;
  ulong alen;
  short sVar19;
  uint uVar20;
  qsizetype qVar21;
  qsizetype qVar22;
  long in_FS_OFFSET;
  QStringView str;
  QStringView str_00;
  uchar skiptable [256];
  uchar local_138 [256];
  long local_38;
  
  alen = needle0.m_size;
  pcVar7 = needle0.m_data;
  uVar16 = haystack0.m_size;
  pcVar17 = haystack0.m_data;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (alen == 1) {
    qVar21 = -1;
    if (-from == uVar16 || (long)-uVar16 < from) {
      lVar8 = 0;
      if (0 < (long)(from + uVar16)) {
        lVar8 = from + uVar16;
      }
      if (-1 < from) {
        lVar8 = from;
      }
      if (lVar8 < (long)uVar16) {
        cVar1 = *pcVar7;
        str.m_data = (long)(uVar16 * 2 + lVar8 * -2) >> 1;
        if (cs == CaseSensitive) {
          str.m_size._0_2_ = cVar1;
          str.m_size._2_6_ = 0;
          pcVar7 = qustrchr((QtPrivate *)(pcVar17 + lVar8),str,cVar1);
        }
        else {
          str_00.m_size._0_2_ = cVar1;
          str_00.m_data = (storage_type_conflict *)str.m_data;
          str_00.m_size._2_6_ = 0;
          pcVar7 = qustrcasechr((QtPrivate *)(pcVar17 + lVar8),str_00,cVar1);
        }
        if (pcVar7 != pcVar17 + uVar16) {
          lVar8 = (long)pcVar7 - (long)pcVar17;
LAB_00120d64:
          qVar21 = lVar8 >> 1;
        }
      }
    }
  }
  else {
    lVar8 = (from >> 0x3f & uVar16) + from;
    qVar22 = -1;
    qVar21 = qVar22;
    if (((lVar8 + alen <= uVar16) && (qVar21 = lVar8, alen != 0)) && (qVar21 = qVar22, uVar16 != 0))
    {
      if ((long)alen < 6 || (long)uVar16 < 0x1f5) {
        pcVar9 = pcVar17 + lVar8;
        lVar15 = uVar16 - alen;
        bVar10 = (byte)(alen - 1);
        if (cs == CaseSensitive) {
          if ((long)alen < 1) {
            lVar12 = 0;
            lVar14 = 0;
          }
          else {
            lVar14 = 0;
            lVar12 = 0;
            uVar16 = 0;
            do {
              lVar14 = (ulong)(ushort)pcVar7[uVar16] + lVar14 * 2;
              lVar12 = (ulong)(ushort)pcVar9[uVar16] + lVar12 * 2;
              uVar16 = uVar16 + 1;
            } while (alen != uVar16);
          }
          if (lVar8 <= lVar15) {
            lVar12 = lVar12 - (ulong)(ushort)pcVar9[alen - 1];
            do {
              lVar12 = (ulong)(ushort)pcVar9[alen - 1] + lVar12;
              if (lVar12 == lVar14) {
                uVar16 = 0;
                while (pcVar7[uVar16] == pcVar9[uVar16]) {
                  uVar16 = uVar16 + 1;
                  if (alen == uVar16) {
                    lVar8 = (long)pcVar9 - (long)pcVar17;
                    goto LAB_00120d64;
                  }
                }
              }
              if (alen < 0x41) {
                lVar12 = lVar12 - ((ulong)(ushort)*pcVar9 << (bVar10 & 0x3f));
              }
              lVar12 = lVar12 * 2;
              pcVar9 = pcVar9 + 1;
            } while (pcVar9 <= pcVar17 + lVar15);
          }
        }
        else {
          if ((long)alen < 1) {
            lVar14 = 0;
            lVar12 = 0;
          }
          else {
            lVar11 = 0;
            lVar12 = 0;
            lVar14 = 0;
            uVar16 = alen;
            do {
              uVar2 = *(ushort *)((long)pcVar7 + lVar11);
              uVar18 = (uint)uVar2;
              if ((lVar11 != 0 && (uVar2 & 0xfc00) == 0xdc00) &&
                 (uVar3 = *(ushort *)((long)pcVar7 + lVar11 + -2), (uVar3 & 0xfc00) == 0xd800)) {
                uVar18 = (uint)uVar2 + (uint)uVar3 * 0x400 + 0xfca02400;
              }
              uVar13 = 0xff;
              if (uVar18 < 0x11000) {
                uVar13 = 0x1f;
              }
              uVar20 = uVar18 >> 5;
              if (0x10fff < uVar18) {
                uVar20 = (uVar18 - 0x11000 >> 8) + 0x880;
              }
              sVar19 = (short)((uint)(int)(short)*(ushort *)
                                                  (QUnicodeTables::uc_properties +
                                                  (ulong)*(ushort *)
                                                          (QUnicodeTables::uc_property_trie +
                                                          (ulong)((uVar13 & uVar18) +
                                                                 (uint)*(ushort *)
                                                                        (QUnicodeTables::
                                                                         uc_property_trie +
                                                                        (ulong)uVar20 * 2)) * 2) *
                                                  0x14 + 0xe) >> 1);
              if ((*(ushort *)
                    (QUnicodeTables::uc_properties +
                    (ulong)*(ushort *)
                            (QUnicodeTables::uc_property_trie +
                            (ulong)((uVar13 & uVar18) +
                                   (uint)*(ushort *)
                                          (QUnicodeTables::uc_property_trie + (ulong)uVar20 * 2)) *
                            2) * 0x14 + 0xe) & 1) == 0) {
                uVar18 = uVar18 + (int)sVar19;
              }
              else if (*(short *)(QUnicodeTables::specialCaseMap + (long)sVar19 * 2) == 1) {
                uVar18 = (uint)*(ushort *)(QUnicodeTables::specialCaseMap + (long)sVar19 * 2 + 2);
              }
              uVar2 = *(ushort *)((long)pcVar9 + lVar11);
              uVar13 = (uint)uVar2;
              if ((pcVar17 < (char16_t *)((long)pcVar9 + lVar11) && (uVar2 & 0xfc00) == 0xdc00) &&
                 (uVar3 = *(ushort *)((long)pcVar9 + lVar11 + -2), (uVar3 & 0xfc00) == 0xd800)) {
                uVar13 = (uint)uVar2 + (uint)uVar3 * 0x400 + 0xfca02400;
              }
              uVar20 = 0xff;
              if (uVar13 < 0x11000) {
                uVar20 = 0x1f;
              }
              uVar4 = uVar13 >> 5;
              if (0x10fff < uVar13) {
                uVar4 = (uVar13 - 0x11000 >> 8) + 0x880;
              }
              sVar19 = (short)((uint)(int)(short)*(ushort *)
                                                  (QUnicodeTables::uc_properties +
                                                  (ulong)*(ushort *)
                                                          (QUnicodeTables::uc_property_trie +
                                                          (ulong)((uVar20 & uVar13) +
                                                                 (uint)*(ushort *)
                                                                        (QUnicodeTables::
                                                                         uc_property_trie +
                                                                        (ulong)uVar4 * 2)) * 2) *
                                                  0x14 + 0xe) >> 1);
              if ((*(ushort *)
                    (QUnicodeTables::uc_properties +
                    (ulong)*(ushort *)
                            (QUnicodeTables::uc_property_trie +
                            (ulong)((uVar20 & uVar13) +
                                   (uint)*(ushort *)
                                          (QUnicodeTables::uc_property_trie + (ulong)uVar4 * 2)) * 2
                            ) * 0x14 + 0xe) & 1) == 0) {
                uVar13 = uVar13 + (int)sVar19;
              }
              else if (*(short *)(QUnicodeTables::specialCaseMap + (long)sVar19 * 2) == 1) {
                uVar13 = (uint)*(ushort *)(QUnicodeTables::specialCaseMap + (long)sVar19 * 2 + 2);
              }
              lVar12 = lVar12 * 2 + (ulong)uVar18;
              lVar14 = lVar14 * 2 + (ulong)uVar13;
              lVar11 = lVar11 + 2;
              uVar16 = uVar16 - 1;
            } while (uVar16 != 0);
          }
          pcVar9 = pcVar9 + (alen - 1);
          cVar1 = *pcVar9;
          uVar18 = (uint)(ushort)cVar1;
          if ((pcVar17 < pcVar9 && ((ushort)cVar1 & 0xfc00) == 0xdc00) &&
             ((pcVar9[-1] & 0xfc00U) == 0xd800)) {
            uVar18 = (uint)(ushort)cVar1 + (uint)(ushort)pcVar9[-1] * 0x400 + 0xfca02400;
          }
          uVar13 = 0xff;
          if (uVar18 < 0x11000) {
            uVar13 = 0x1f;
          }
          uVar20 = uVar18 >> 5;
          if (0x10fff < uVar18) {
            uVar20 = (uVar18 - 0x11000 >> 8) + 0x880;
          }
          sVar19 = (short)((uint)(int)(short)*(ushort *)
                                              (QUnicodeTables::uc_properties +
                                              (ulong)*(ushort *)
                                                      (QUnicodeTables::uc_property_trie +
                                                      (ulong)((uVar13 & uVar18) +
                                                             (uint)*(ushort *)
                                                                    (QUnicodeTables::
                                                                     uc_property_trie +
                                                                    (ulong)uVar20 * 2)) * 2) * 0x14
                                              + 0xe) >> 1);
          if ((*(ushort *)
                (QUnicodeTables::uc_properties +
                (ulong)*(ushort *)
                        (QUnicodeTables::uc_property_trie +
                        (ulong)((uVar13 & uVar18) +
                               (uint)*(ushort *)
                                      (QUnicodeTables::uc_property_trie + (ulong)uVar20 * 2)) * 2) *
                0x14 + 0xe) & 1) == 0) {
            uVar18 = uVar18 + (int)sVar19;
          }
          else if (*(short *)(QUnicodeTables::specialCaseMap + (long)sVar19 * 2) == 1) {
            uVar18 = (uint)*(ushort *)(QUnicodeTables::specialCaseMap + (long)sVar19 * 2 + 2);
          }
          if (lVar8 <= lVar15) {
            lVar14 = lVar14 - (ulong)uVar18;
            lVar8 = lVar8 * 2;
            lVar11 = alen * 2 + -2;
            do {
              uVar2 = *(ushort *)((long)pcVar17 + lVar8 + lVar11);
              uVar18 = (uint)uVar2;
              if ((pcVar17 < (char16_t *)((long)pcVar17 + lVar8 + lVar11) &&
                   (uVar2 & 0xfc00) == 0xdc00) &&
                 (uVar3 = *(ushort *)((long)pcVar17 + lVar8 + alen * 2 + -4),
                 (uVar3 & 0xfc00) == 0xd800)) {
                uVar18 = (uint)uVar2 + (uint)uVar3 * 0x400 + 0xfca02400;
              }
              uVar13 = 0xff;
              if (uVar18 < 0x11000) {
                uVar13 = 0x1f;
              }
              uVar20 = uVar18 >> 5;
              if (0x10fff < uVar18) {
                uVar20 = (uVar18 - 0x11000 >> 8) + 0x880;
              }
              sVar19 = (short)((uint)(int)(short)*(ushort *)
                                                  (QUnicodeTables::uc_properties +
                                                  (ulong)*(ushort *)
                                                          (QUnicodeTables::uc_property_trie +
                                                          (ulong)((uVar13 & uVar18) +
                                                                 (uint)*(ushort *)
                                                                        (QUnicodeTables::
                                                                         uc_property_trie +
                                                                        (ulong)uVar20 * 2)) * 2) *
                                                  0x14 + 0xe) >> 1);
              if ((*(ushort *)
                    (QUnicodeTables::uc_properties +
                    (ulong)*(ushort *)
                            (QUnicodeTables::uc_property_trie +
                            (ulong)((uVar13 & uVar18) +
                                   (uint)*(ushort *)
                                          (QUnicodeTables::uc_property_trie + (ulong)uVar20 * 2)) *
                            2) * 0x14 + 0xe) & 1) == 0) {
                uVar18 = uVar18 + (int)sVar19;
              }
              else if (*(short *)(QUnicodeTables::specialCaseMap + (long)sVar19 * 2) == 1) {
                uVar18 = (uint)*(ushort *)(QUnicodeTables::specialCaseMap + (long)sVar19 * 2 + 2);
              }
              pcVar9 = (char16_t *)((long)pcVar17 + lVar8);
              lVar14 = lVar14 + (ulong)uVar18;
              if ((lVar14 == lVar12) && (iVar6 = ucstricmp(alen,pcVar7,alen,pcVar9), iVar6 == 0)) {
                qVar21 = lVar8 >> 1;
                goto LAB_0012131a;
              }
              if (alen < 0x41) {
                cVar1 = *pcVar9;
                uVar18 = (uint)(ushort)cVar1;
                if ((pcVar17 < pcVar9 && ((ushort)cVar1 & 0xfc00) == 0xdc00) &&
                   (uVar2 = *(ushort *)((long)pcVar17 + lVar8 + -2), (uVar2 & 0xfc00) == 0xd800)) {
                  uVar18 = (uint)(ushort)cVar1 + (uint)uVar2 * 0x400 + 0xfca02400;
                }
                uVar13 = 0xff;
                if (uVar18 < 0x11000) {
                  uVar13 = 0x1f;
                }
                uVar20 = uVar18 >> 5;
                if (0x10fff < uVar18) {
                  uVar20 = (uVar18 - 0x11000 >> 8) + 0x880;
                }
                sVar19 = (short)((uint)(int)(short)*(ushort *)
                                                    (QUnicodeTables::uc_properties +
                                                    (ulong)*(ushort *)
                                                            (QUnicodeTables::uc_property_trie +
                                                            (ulong)((uVar13 & uVar18) +
                                                                   (uint)*(ushort *)
                                                                          (QUnicodeTables::
                                                                           uc_property_trie +
                                                                          (ulong)uVar20 * 2)) * 2) *
                                                    0x14 + 0xe) >> 1);
                if ((*(ushort *)
                      (QUnicodeTables::uc_properties +
                      (ulong)*(ushort *)
                              (QUnicodeTables::uc_property_trie +
                              (ulong)((uVar13 & uVar18) +
                                     (uint)*(ushort *)
                                            (QUnicodeTables::uc_property_trie + (ulong)uVar20 * 2))
                              * 2) * 0x14 + 0xe) & 1) == 0) {
                  uVar18 = uVar18 + (int)sVar19;
                }
                else if (*(short *)(QUnicodeTables::specialCaseMap + (long)sVar19 * 2) == 1) {
                  uVar18 = (uint)*(ushort *)(QUnicodeTables::specialCaseMap + (long)sVar19 * 2 + 2);
                }
                lVar14 = lVar14 - ((ulong)uVar18 << (bVar10 & 0x3f));
              }
              lVar14 = lVar14 * 2;
              lVar5 = lVar8 + 2;
              lVar8 = lVar8 + 2;
            } while ((char16_t *)((long)pcVar17 + lVar5) <= pcVar17 + lVar15);
          }
          qVar21 = -1;
        }
      }
      else {
        memset(local_138,0xaa,0x100);
        bm_init_skiptable(needle0,local_138,cs);
        qVar21 = 0;
        if (0 < lVar8) {
          qVar21 = lVar8;
        }
        qVar21 = bm_find(haystack0,qVar21,needle0,local_138,cs);
      }
    }
  }
LAB_0012131a:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return qVar21;
}

Assistant:

qsizetype QtPrivate::findString(QStringView haystack0, qsizetype from, QStringView needle0, Qt::CaseSensitivity cs) noexcept
{
    const qsizetype l = haystack0.size();
    const qsizetype sl = needle0.size();
    if (sl == 1)
        return findString(haystack0, from, needle0[0], cs);
    if (from < 0)
        from += l;
    if (std::size_t(sl + from) > std::size_t(l))
        return -1;
    if (!sl)
        return from;
    if (!l)
        return -1;

    /*
        We use the Boyer-Moore algorithm in cases where the overhead
        for the skip table should pay off, otherwise we use a simple
        hash function.
    */
    if (l > 500 && sl > 5)
        return qFindStringBoyerMoore(haystack0, from, needle0, cs);

    auto sv = [sl](const char16_t *v) { return QStringView(v, sl); };
    /*
        We use some hashing for efficiency's sake. Instead of
        comparing strings, we compare the hash value of str with that
        of a part of this QString. Only if that matches, we call
        qt_string_compare().
    */
    const char16_t *needle = needle0.utf16();
    const char16_t *haystack = haystack0.utf16() + from;
    const char16_t *end = haystack0.utf16() + (l - sl);
    const qregisteruint sl_minus_1 = sl - 1;
    qregisteruint hashNeedle = 0, hashHaystack = 0;
    qsizetype idx;

    if (cs == Qt::CaseSensitive) {
        for (idx = 0; idx < sl; ++idx) {
            hashNeedle = ((hashNeedle<<1) + needle[idx]);
            hashHaystack = ((hashHaystack<<1) + haystack[idx]);
        }
        hashHaystack -= haystack[sl_minus_1];

        while (haystack <= end) {
            hashHaystack += haystack[sl_minus_1];
            if (hashHaystack == hashNeedle
                 && QtPrivate::compareStrings(needle0, sv(haystack), Qt::CaseSensitive) == 0)
                return haystack - haystack0.utf16();

            REHASH(*haystack);
            ++haystack;
        }
    } else {
        const char16_t *haystack_start = haystack0.utf16();
        for (idx = 0; idx < sl; ++idx) {
            hashNeedle = (hashNeedle<<1) + foldCase(needle + idx, needle);
            hashHaystack = (hashHaystack<<1) + foldCase(haystack + idx, haystack_start);
        }
        hashHaystack -= foldCase(haystack + sl_minus_1, haystack_start);

        while (haystack <= end) {
            hashHaystack += foldCase(haystack + sl_minus_1, haystack_start);
            if (hashHaystack == hashNeedle
                 && QtPrivate::compareStrings(needle0, sv(haystack), Qt::CaseInsensitive) == 0)
                return haystack - haystack0.utf16();

            REHASH(foldCase(haystack, haystack_start));
            ++haystack;
        }
    }
    return -1;
}